

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O1

bool __thiscall World::resetTet(World *this,TetrominoType *type)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  Vec2d *pVVar4;
  TetrominoType *pTVar5;
  Tetromino *pTVar6;
  Vec2d *direction;
  vector<Quad_*,_std::allocator<Quad_*>_> *pvVar7;
  float fVar8;
  undefined1 local_38 [8];
  Translation translation;
  
  pVVar4 = (Vec2d *)operator_new(8);
  Vec2d::Vec2d(pVVar4,this->spawnPoint);
  if (this->nextTet == (Tetromino *)0x0) {
    pTVar5 = TetrominoTypeFactory::getRandomType(this->typeFactory);
    iVar2 = TetrominoType::getHeight(pTVar5);
    fVar8 = Vec2d::getY(pVVar4);
    Vec2d::setY(pVVar4,fVar8 - (float)iVar2);
    pTVar6 = TetrominoFactory::getTetromino(this->tetFactory,pTVar5,pVVar4);
    pTVar6 = Tetromino::withDirection(pTVar6,this->defaultDirection);
  }
  else {
    if (this->activeTet != (Tetromino *)0x0) {
      (**(code **)(*(long *)&this->activeTet->super_Entity + 8))();
    }
    pTVar6 = this->nextTet;
  }
  this->activeTet = pTVar6;
  pTVar5 = TetrominoTypeFactory::getRandomType(this->typeFactory);
  iVar2 = TetrominoType::getHeight(pTVar5);
  operator_delete(pVVar4);
  pVVar4 = (Vec2d *)operator_new(8);
  Vec2d::Vec2d(pVVar4,this->spawnPoint);
  if (this->mode == INFINITY_MODE) {
    iVar3 = rand();
    Vec2d::setX(pVVar4,(float)(iVar3 % 8 + 1));
  }
  fVar8 = Vec2d::getY(pVVar4);
  Vec2d::setY(pVVar4,fVar8 - (float)iVar2);
  pTVar6 = TetrominoFactory::getTetromino(this->tetFactory,pTVar5,pVVar4);
  pTVar6 = Tetromino::withDirection(pTVar6,this->defaultDirection);
  this->nextTet = pTVar6;
  direction = (Vec2d *)(**(code **)(*(long *)&this->activeTet->super_Entity + 0x10))();
  Translation::Translation((Translation *)local_38,direction);
  pvVar7 = (vector<Quad_*,_std::allocator<Quad_*>_> *)
           (**(code **)(*(long *)&this->activeTet->super_Entity + 0x48))();
  pvVar7 = Translation::transform((Translation *)local_38,pvVar7);
  bVar1 = (**(code **)(*(long *)&this->heap->super_Entity + 0x50))(this->heap,pvVar7);
  Quad::deleteQuads(pvVar7,true);
  operator_delete(pVVar4);
  Translation::~Translation((Translation *)local_38);
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool World::resetTet(TetrominoType* type) {
    Vec2d* newCoords = new Vec2d(spawnPoint);
    if (nextTet == nullptr) {
        TetrominoType* randomType = typeFactory->getRandomType();
        int spawnOffset = randomType->getHeight();
        newCoords->setY(newCoords->getY() - spawnOffset);
        activeTet = tetFactory->getTetromino(randomType, newCoords)->withDirection(defaultDirection);
    } else {
        delete activeTet;
        activeTet = nextTet;
    }

    type = typeFactory->getRandomType();
    int spawnOffset = type->getHeight();
    delete newCoords;

    newCoords = new Vec2d(spawnPoint);
    if (mode == INFINITY_MODE) newCoords->setX((rand() % 8) + 1);
    newCoords->setY(newCoords->getY() - spawnOffset);
    nextTet = tetFactory->getTetromino(type, newCoords)->withDirection(defaultDirection);
    
    Translation translation = Translation(activeTet->getCoords());
    
    vector<Quad*>* resetQuads = translation.transform(activeTet->getQuads());
    bool success = !heap->collidesWithQuads(resetQuads);
    
    Quad::deleteQuads(resetQuads, true);

    delete newCoords;
    
    return success;
}